

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgregoriancalendar.cpp
# Opt level: O2

int QGregorianCalendar::yearStartWeekDay(int year)

{
  R_conflict4 RVar1;
  R_conflict4 RVar2;
  int iVar3;
  
  iVar3 = -(year >> 0x1f) + year + -0x321;
  RVar1 = QRoundingDown::qDivMod<100U,_int,_true>(iVar3);
  RVar2 = QRoundingDown::qDivMod<400U,_int,_true>(iVar3);
  iVar3 = QRoundingDown::qMod<7u,int>
                    ((((iVar3 >> 2) + -(year >> 0x1f) + year + -0x321) - RVar1.quotient) +
                     RVar2.quotient);
  return iVar3 + 1;
}

Assistant:

int QGregorianCalendar::yearStartWeekDay(int year)
{
    // Equivalent to weekDayOfJulian(julianForParts({year, 1, 1})
    const int y = year - (year < 0 ? 800 : 801);
    return qMod<7>(y + qDiv<4>(y) - qDiv<100>(y) + qDiv<400>(y)) + 1;
}